

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O1

REF_STATUS ref_histogram_add_ratio(REF_HISTOGRAM ref_histogram,REF_GRID ref_grid)

{
  REF_DBL *pRVar1;
  uint uVar2;
  long lVar3;
  undefined8 uVar4;
  char *pcVar5;
  REF_EDGE ref_edge;
  REF_INT part;
  REF_DBL ratio;
  REF_EDGE local_50;
  int local_44;
  REF_HISTOGRAM local_40;
  REF_DBL local_38;
  
  uVar2 = ref_edge_create(&local_50,ref_grid);
  if (uVar2 == 0) {
    local_40 = ref_histogram;
    if (0 < local_50->n) {
      lVar3 = 0;
      do {
        uVar2 = ref_edge_part(local_50,(REF_INT)lVar3,&local_44);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
                 ,0x184,"ref_histogram_add_ratio",(ulong)uVar2,"edge part");
          return uVar2;
        }
        if (local_44 == ref_grid->mpi->id) {
          uVar2 = ref_node_ratio(ref_grid->node,local_50->e2n[lVar3 * 2],
                                 local_50->e2n[lVar3 * 2 + 1],&local_38);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
                   ,0x189,"ref_histogram_add_ratio",(ulong)uVar2,"rat");
            return uVar2;
          }
          uVar2 = ref_histogram_add(local_40,local_38);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
                   ,0x192,"ref_histogram_add_ratio",(ulong)uVar2,"add");
            pRVar1 = ref_grid->node->real;
            lVar3 = (long)local_50->e2n[lVar3 * 2];
            printf("ratio %e at %f %f %f\n",local_38,pRVar1[lVar3 * 0xf],pRVar1[lVar3 * 0xf + 1],
                   pRVar1[lVar3 * 0xf + 2]);
            return uVar2;
          }
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < local_50->n);
    }
    uVar2 = ref_histogram_gather(local_40,ref_grid->mpi);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
             0x196,"ref_histogram_add_ratio",(ulong)uVar2,"gather");
      return uVar2;
    }
    if (0 < local_50->n) {
      lVar3 = 0;
      do {
        uVar2 = ref_edge_part(local_50,(REF_INT)lVar3,&local_44);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
                 ,0x199,"ref_histogram_add_ratio",(ulong)uVar2,"edge part");
          return uVar2;
        }
        if (local_44 == ref_grid->mpi->id) {
          uVar2 = ref_node_ratio(ref_grid->node,local_50->e2n[lVar3 * 2],
                                 local_50->e2n[lVar3 * 2 + 1],&local_38);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
                   ,0x19e,"ref_histogram_add_ratio",(ulong)uVar2,"rat");
            return uVar2;
          }
          uVar2 = ref_histogram_add_stat(local_40,local_38);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
                   ,0x19f,"ref_histogram_add_ratio",(ulong)uVar2,"add");
            return uVar2;
          }
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < local_50->n);
    }
    uVar2 = ref_histogram_gather_stat(local_40,ref_grid->mpi);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
             0x1a3,"ref_histogram_add_ratio",(ulong)uVar2,"gather");
      return uVar2;
    }
    uVar2 = ref_edge_free(local_50);
    if (uVar2 == 0) {
      return 0;
    }
    pcVar5 = "free edge";
    uVar4 = 0x1a5;
  }
  else {
    pcVar5 = "make edges";
    uVar4 = 0x181;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",uVar4
         ,"ref_histogram_add_ratio",(ulong)uVar2,pcVar5);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_add_ratio(REF_HISTOGRAM ref_histogram,
                                           REF_GRID ref_grid) {
  REF_EDGE ref_edge;
  REF_INT edge, part;
  REF_DBL ratio;

  RSS(ref_edge_create(&ref_edge, ref_grid), "make edges");

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (part == ref_mpi_rank(ref_grid_mpi(ref_grid))) {
      RSS(ref_node_ratio(ref_grid_node(ref_grid),
                         ref_edge_e2n(ref_edge, 0, edge),
                         ref_edge_e2n(ref_edge, 1, edge), &ratio),
          "rat");
      RSB(ref_histogram_add(ref_histogram, ratio), "add", {
        printf("ratio %e at %f %f %f\n", ratio,
               ref_node_xyz(ref_grid_node(ref_grid), 0,
                            ref_edge_e2n(ref_edge, 0, edge)),
               ref_node_xyz(ref_grid_node(ref_grid), 1,
                            ref_edge_e2n(ref_edge, 0, edge)),
               ref_node_xyz(ref_grid_node(ref_grid), 2,
                            ref_edge_e2n(ref_edge, 0, edge)));
      });
    }
  }

  RSS(ref_histogram_gather(ref_histogram, ref_grid_mpi(ref_grid)), "gather");

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (part == ref_mpi_rank(ref_grid_mpi(ref_grid))) {
      RSS(ref_node_ratio(ref_grid_node(ref_grid),
                         ref_edge_e2n(ref_edge, 0, edge),
                         ref_edge_e2n(ref_edge, 1, edge), &ratio),
          "rat");
      RSS(ref_histogram_add_stat(ref_histogram, ratio), "add");
    }
  }
  RSS(ref_histogram_gather_stat(ref_histogram, ref_grid_mpi(ref_grid)),
      "gather");

  RSS(ref_edge_free(ref_edge), "free edge");

  return REF_SUCCESS;
}